

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int __thiscall ncnn::BinaryOp::forward_inplace(BinaryOp *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int i_7;
  void *pvVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  float fVar10;
  
  switch(this->op_type) {
  case 0:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    pvVar7 = bottom_top_blob->data;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar7 + uVar9 * 4) = *(float *)((long)pvVar7 + uVar9 * 4) + fVar1;
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
    break;
  case 1:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    pvVar7 = bottom_top_blob->data;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar7 + uVar9 * 4) = *(float *)((long)pvVar7 + uVar9 * 4) - fVar1;
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
    break;
  case 2:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    pvVar7 = bottom_top_blob->data;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar7 + uVar9 * 4) = *(float *)((long)pvVar7 + uVar9 * 4) * fVar1;
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
    break;
  case 3:
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar8;
    }
    pvVar7 = bottom_top_blob->data;
    fVar1 = this->b;
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar7 + uVar9 * 4) = *(float *)((long)pvVar7 + uVar9 * 4) * (1.0 / fVar1);
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
    break;
  case 4:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    pvVar7 = bottom_top_blob->data;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        fVar10 = *(float *)((long)pvVar7 + uVar9 * 4);
        if (fVar10 <= fVar1) {
          fVar10 = fVar1;
        }
        *(float *)((long)pvVar7 + uVar9 * 4) = fVar10;
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
    break;
  case 5:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    pvVar7 = bottom_top_blob->data;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        fVar10 = *(float *)((long)pvVar7 + uVar9 * 4);
        if (fVar1 <= fVar10) {
          fVar10 = fVar1;
        }
        *(float *)((long)pvVar7 + uVar9 * 4) = fVar10;
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
    break;
  case 6:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    pvVar7 = bottom_top_blob->data;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        fVar10 = powf(*(float *)((long)pvVar7 + uVar9 * 4),fVar1);
        *(float *)((long)pvVar7 + uVar9 * 4) = fVar10;
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
    break;
  case 7:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    pvVar7 = bottom_top_blob->data;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar7 + uVar9 * 4) = fVar1 - *(float *)((long)pvVar7 + uVar9 * 4);
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
    break;
  case 8:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    pvVar7 = bottom_top_blob->data;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pvVar7 + uVar9 * 4) = fVar1 / *(float *)((long)pvVar7 + uVar9 * 4);
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
  }
  return 0;
}

Assistant:

int BinaryOp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (op_type == Operation_ADD)
        return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);

    if (op_type == Operation_SUB)
        return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);

    if (op_type == Operation_MUL)
        return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);

    if (op_type == Operation_DIV)
        return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);

    if (op_type == Operation_MAX)
        return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);

    if (op_type == Operation_MIN)
        return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);

    if (op_type == Operation_POW)
        return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);

    if (op_type == Operation_RSUB)
        return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);

    if (op_type == Operation_RDIV)
        return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);

    return 0;
}